

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,size_t other)

{
  undefined8 extraout_RAX;
  RangeValue RVar1;
  RangeValue retval;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == false) {
    local_20._val = other + this->_val;
    local_20._isUnbound = false;
  }
  RVar1._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  RVar1._isUnbound = local_20._isUnbound;
  RVar1._val = local_20._val;
  return RVar1;
}

Assistant:

RangeValue RangeValue::operator+ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound)
        retval.set(_val + other);
    return retval;
}